

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray-bmp.hxx
# Opt level: O2

void andres::bmp::save<unsigned_char>
               (ostream *stream,Marray<unsigned_char,_std::allocator<unsigned_long>_> *in)

{
  uint __line;
  size_t sVar1;
  size_t sVar2;
  ostream *poVar3;
  reference puVar4;
  size_t *begin;
  size_t *end;
  runtime_error *this;
  char *__assertion;
  uint32_t width;
  char cVar5;
  ulong args;
  allocator_type local_b9;
  uint8_t padding [3];
  CoordinateOrder local_80;
  View<unsigned_char,_false,_std::allocator<unsigned_long>_> local_70;
  
  sVar1 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::dimension
                    (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
  if (sVar1 == 2) {
    sVar1 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                      (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0);
    if (sVar1 >> 0x20 == 0) {
      sVar1 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                        (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1);
      if (sVar1 >> 0x20 == 0) {
        View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                  (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
        if ((in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
            coordinateOrder_ == FirstMajorOrder) {
          begin = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeBegin
                            (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
          end = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shapeEnd
                          (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
          local_70.data_._0_1_ = 1;
          Marray<unsigned_char,std::allocator<unsigned_long>>::Marray<unsigned_long_const*>
                    ((Marray<unsigned_char,std::allocator<unsigned_long>> *)padding,begin,end,
                     (uchar *)&local_70,&defaultOrder,&local_b9);
          View<unsigned_char,_false,_std::allocator<unsigned_long>_>::View
                    (&local_70,(View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)padding
                    );
          View<unsigned_char,_false,_std::allocator<unsigned_long>_>::operator=
                    (&local_70,&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>
                    );
          marray_detail::Geometry<std::allocator<unsigned_long>_>::~Geometry(&local_70.geometry_);
          View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<unsigned_char,_false,_std::allocator<unsigned_long>_> *)padding);
          if (local_80 != LastMajorOrder) {
            __assertion = "tmp.coordinateOrder() == LastMajorOrder";
            __line = 0x6b;
            goto LAB_00104635;
          }
          save<unsigned_char>(stream,(Marray<unsigned_char,_std::allocator<unsigned_long>_> *)
                                     padding);
          Marray<unsigned_char,_std::allocator<unsigned_long>_>::~Marray
                    ((Marray<unsigned_char,_std::allocator<unsigned_long>_> *)padding);
        }
        else {
          View<unsigned_char,_false,_std::allocator<unsigned_long>_>::testInvariant
                    (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>);
          if ((in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>).geometry_.
              coordinateOrder_ != LastMajorOrder) {
            __assertion = "in.coordinateOrder() == LastMajorOrder";
            __line = 0x70;
LAB_00104635:
            __assert_fail(__assertion,
                          "/workspace/llm4binary/github/license_c_cmakelists/bjoern-andres[P]marray/include/andres/marray-bmp.hxx"
                          ,__line,
                          "void andres::bmp::save(std::ostream &, const Marray<std::uint8_t> &)");
          }
          cVar5 = '\0';
          sVar1 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                            (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,0
                            );
          sVar2 = View<unsigned_char,_false,_std::allocator<unsigned_long>_>::shape
                            (&in->super_View<unsigned_char,_false,_std::allocator<unsigned_long>_>,1
                            );
          padding[2] = '\0';
          padding[0] = '\0';
          padding[1] = '\0';
          width = (uint32_t)sVar1;
          fileHeader((uint32_t)sVar2,width + (-width & 3));
          std::ostream::write((char *)stream,0x10b121);
          infoHeader(width,(uint32_t)sVar2,8);
          std::ostream::write((char *)stream,0x10b130);
          do {
            poVar3 = std::operator<<(stream,cVar5);
            poVar3 = std::operator<<(poVar3,cVar5);
            poVar3 = std::operator<<(poVar3,cVar5);
            std::ostream::operator<<((ostream *)poVar3,0);
            cVar5 = cVar5 + '\x01';
          } while (cVar5 != '\0');
          args = sVar2 & 0xffffffff;
          while (args = args - 1, args != 0xffffffffffffffff) {
            puVar4 = View<unsigned_char,false,std::allocator<unsigned_long>>::operator()
                               ((View<unsigned_char,false,std::allocator<unsigned_long>> *)in,0,args
                               );
            std::ostream::write((char *)stream,(long)puVar4);
            std::ostream::write((char *)stream,(long)padding);
          }
        }
        return;
      }
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"marray is too large for export to BMP");
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"not implemented for Marray of dimension other than 2.");
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
save(
    std::ostream & stream,
    Marray<std::uint8_t> const & in
) {
    if(in.dimension() != 2) {
        throw std::runtime_error("not implemented for Marray of dimension other than 2.");
    }
    if(in.shape(0) > std::numeric_limits<std::uint32_t>::max()
    || in.shape(1) > std::numeric_limits<std::uint32_t>::max()) {
        throw std::runtime_error("marray is too large for export to BMP");
    }
    if(in.coordinateOrder() == FirstMajorOrder) {
        Marray<unsigned char> tmp(in.shapeBegin(), in.shapeEnd(), LastMajorOrder);
        // note: tmp = in; would change in.coordinateOrder() which we do not want. thus:
        static_cast<andres::View<unsigned char, false> >(tmp) = in; // re-order in memory
        assert(tmp.coordinateOrder() == LastMajorOrder);
        save(stream, tmp); // recurse!
        return;
    }

    assert(in.coordinateOrder() == LastMajorOrder);

    std::uint32_t const BYTES_PER_PIXEL = 1;
    std::uint32_t const width = static_cast<std::uint32_t>(in.shape(0));
    std::uint32_t const height = static_cast<std::uint32_t>(in.shape(1));
    std::uint32_t const widthInBytes = width * BYTES_PER_PIXEL;
    std::uint8_t const padding[3] = {0, 0, 0};
    std::uint32_t const paddingSize = (4 - (widthInBytes) % 4) % 4;
    std::uint32_t const stride = widthInBytes + paddingSize;

    stream.write(reinterpret_cast<char const *>(fileHeader(height, stride)), FILE_HEADER_SIZE);
    stream.write(reinterpret_cast<char const *>(infoHeader(width, height, BYTES_PER_PIXEL * 8)), INFO_HEADER_SIZE);

    // write color palette (required by BMP format for <= 8 bits per pixel)
    for(std::uint8_t color = 0; true; ++color) {
        stream << color << color << color << 0; // RGBA32
        if(color == 255) {
            break;
        }
    }

    // write image
    for(size_t j = 0; j < height; ++j) {
        stream.write(reinterpret_cast<char const *>(&in(0, height - j - 1)), width);
        stream.write(reinterpret_cast<char const *>(padding), paddingSize);
    }
}